

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

void __thiscall wasm::Literal::~Literal(Literal *this)

{
  bool bVar1;
  bool local_32;
  HeapType local_20;
  HeapType local_18;
  Literal *local_10;
  Literal *this_local;
  
  local_10 = this;
  bVar1 = wasm::Type::isBasic(&this->type);
  if (!bVar1) {
    bVar1 = isNull(this);
    local_32 = true;
    if (!bVar1) {
      bVar1 = isData(this);
      local_32 = true;
      if (!bVar1) {
        local_18 = wasm::Type::getHeapType(&this->type);
        bVar1 = HeapType::isMaybeShared(&local_18,ext);
        local_32 = true;
        if (!bVar1) {
          local_20 = wasm::Type::getHeapType(&this->type);
          local_32 = HeapType::isMaybeShared(&local_20,any);
        }
      }
    }
    if (local_32 == false) {
      bVar1 = isExn(this);
      if (bVar1) {
        std::shared_ptr<wasm::ExnData>::~shared_ptr((shared_ptr<wasm::ExnData> *)this);
      }
    }
    else {
      std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)this);
    }
  }
  return;
}

Assistant:

Literal::~Literal() {
  // Early exit for the common case; basic types need no special handling.
  if (type.isBasic()) {
    return;
  }
  if (isNull() || isData() || type.getHeapType().isMaybeShared(HeapType::ext) ||
      type.getHeapType().isMaybeShared(HeapType::any)) {
    gcData.~shared_ptr();
  } else if (isExn()) {
    exnData.~shared_ptr();
  }
}